

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

int32_t decode_unicode_escape(char *str)

{
  char cVar1;
  int iVar2;
  int local_20;
  int iStack_1c;
  char c;
  int32_t value;
  int i;
  char *str_local;
  
  local_20 = 0;
  if (*str != 'u') {
    __assert_fail("str[0] == \'u\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                  ,0x117,"int32_t decode_unicode_escape(const char *)");
  }
  iStack_1c = 1;
  do {
    if (4 < iStack_1c) {
      return local_20;
    }
    cVar1 = str[iStack_1c];
    if ((cVar1 < '0') || ('9' < cVar1)) {
      if ((cVar1 < 'a') || ('z' < cVar1)) {
        if ((cVar1 < 'A') || ('Z' < cVar1)) {
          return -1;
        }
        iVar2 = cVar1 + -0x37;
      }
      else {
        iVar2 = cVar1 + -0x57;
      }
    }
    else {
      iVar2 = cVar1 + -0x30;
    }
    local_20 = iVar2 + local_20 * 0x10;
    iStack_1c = iStack_1c + 1;
  } while( true );
}

Assistant:

static int32_t decode_unicode_escape(const char *str) {
    int i;
    int32_t value = 0;

    assert(str[0] == 'u');

    for (i = 1; i <= 4; i++) {
        char c = str[i];
        value <<= 4;
        if (l_isdigit(c))
            value += c - '0';
        else if (l_islower(c))
            value += c - 'a' + 10;
        else if (l_isupper(c))
            value += c - 'A' + 10;
        else
            return -1;
    }

    return value;
}